

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_errmsg(sqlite3 *db)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  if (db == (sqlite3 *)0x0) {
    pcVar3 = "out of memory";
  }
  else {
    iVar2 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar2 == 0) {
      sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x26561,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      pcVar3 = "bad parameter or other API misuse";
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        if (db->errCode == 0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = (char *)sqlite3ValueText(db->pErr,'\x01');
        }
        if (pcVar3 == (char *)0x0) {
          uVar1 = db->errCode;
          if (uVar1 == 0x204) {
            pcVar3 = "abort due to ROLLBACK";
          }
          else if (uVar1 == 0x65) {
            pcVar3 = "no more rows available";
          }
          else if (uVar1 == 100) {
            pcVar3 = "another row available";
          }
          else {
            pcVar3 = "unknown error";
            if (((uVar1 & 0xff) < 0x1d) && ((0x1410004UL >> ((ulong)(byte)uVar1 & 0x3f) & 1) == 0))
            {
              pcVar3 = *(char **)(sqlite3ErrStr_aMsg + (ulong)(byte)uVar1 * 8);
            }
          }
        }
      }
      else {
        pcVar3 = "out of memory";
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
  }
  return pcVar3;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = db->errCode ? (char*)sqlite3_value_text(db->pErr) : 0;
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}